

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

int cargo_set_option_descriptionv(cargo_t ctx,char *optname,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  long lVar2;
  cargo_opt_t *opt;
  size_t name_i;
  size_t opt_i;
  __va_list_tag *p_Stack_30;
  int ret;
  __va_list_tag *ap_local;
  char *fmt_local;
  char *optname_local;
  cargo_t ctx_local;
  
  opt_i._4_4_ = 0;
  name_i = 0;
  opt = (cargo_opt_t *)0x0;
  p_Stack_30 = ap;
  ap_local = (__va_list_tag *)fmt;
  fmt_local = optname;
  optname_local = (char *)ctx;
  if (ctx == (cargo_t)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x1568,
                  "int cargo_set_option_descriptionv(cargo_t, const char *, const char *, struct __va_list_tag *)"
                 );
  }
  iVar1 = _cargo_find_option_name(ctx,optname,&name_i,(size_t *)&opt);
  if (iVar1 == 0) {
    lVar2 = *(long *)(optname_local + 0x80) + name_i * 0x128;
    _cargo_xfree((void *)(lVar2 + 0x28));
    iVar1 = cargo_vasprintf((char **)(lVar2 + 0x28),(char *)ap_local,p_Stack_30);
    ctx_local._4_4_ = -1;
    if (-1 < iVar1) {
      ctx_local._4_4_ = 0;
    }
  }
  else {
    ctx_local._4_4_ = -1;
  }
  return ctx_local._4_4_;
}

Assistant:

int cargo_set_option_descriptionv(cargo_t ctx,
                                  const char *optname,
                                  const char *fmt, va_list ap)
{
    int ret = 0;
    size_t opt_i = 0;
    size_t name_i = 0;
    cargo_opt_t *opt = NULL;
    assert(ctx);

    if (_cargo_find_option_name(ctx, optname, &opt_i, &name_i))
    {
        CARGODBG(1, "Failed to find option \"%s\"\n", optname);
        return -1;
    }

    opt = &ctx->options[opt_i];

    _cargo_xfree(&opt->description);

    ret = cargo_vasprintf(&opt->description, fmt, ap);
    return (ret >= 0) ? 0 : -1;
}